

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O0

void __thiscall
MutableS2ShapeIndex::InteriorTracker::SaveAndClearStateBefore
          (InteriorTracker *this,int32 limit_shape_id)

{
  bool bVar1;
  ostream *poVar2;
  const_iterator local_70;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_68;
  const_iterator local_60;
  int *local_58;
  int *local_50;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  iterator limit;
  S2LogMessage local_28;
  S2LogMessageVoidify local_15;
  int32 local_14;
  InteriorTracker *pIStack_10;
  int32 limit_shape_id_local;
  InteriorTracker *this_local;
  
  local_14 = limit_shape_id;
  pIStack_10 = this;
  bVar1 = std::vector<int,_std::allocator<int>_>::empty(&this->saved_ids_);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_48._M_current = (int *)lower_bound(this,local_14);
    local_50 = (int *)std::vector<int,_std::allocator<int>_>::begin(&this->shape_ids_);
    local_58 = local_48._M_current;
    std::vector<int,std::allocator<int>>::
    assign<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
              ((vector<int,std::allocator<int>> *)&this->saved_ids_,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_50,local_48)
    ;
    local_68._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(&this->shape_ids_);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_60,
               &local_68);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_70,
               &local_48);
    std::vector<int,_std::allocator<int>_>::erase(&this->shape_ids_,local_60,local_70);
    return;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/mutable_s2shape_index.cc"
             ,0x1bc,kFatal,(ostream *)&std::cerr);
  poVar2 = S2LogMessage::stream(&local_28);
  poVar2 = std::operator<<(poVar2,"Check failed: saved_ids_.empty() ");
  S2LogMessageVoidify::operator&(&local_15,poVar2);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_28);
}

Assistant:

void MutableS2ShapeIndex::InteriorTracker::SaveAndClearStateBefore(
    int32 limit_shape_id) {
  S2_DCHECK(saved_ids_.empty());
  ShapeIdSet::iterator limit = lower_bound(limit_shape_id);
  saved_ids_.assign(shape_ids_.begin(), limit);
  shape_ids_.erase(shape_ids_.begin(), limit);
}